

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuaternion.cpp
# Opt level: O2

ChQuaternion<double> *
chrono::Angle_to_Quat
          (ChQuaternion<double> *__return_storage_ptr__,AngleSet angset,ChVector<double> *mangles)

{
  ChMatrix33<double> Acoord;
  ChMatrix33<double> CStack_78;
  ChQuaternion<double> local_30;
  
  __return_storage_ptr__->m_data[0] = 0.0;
  __return_storage_ptr__->m_data[1] = 0.0;
  __return_storage_ptr__->m_data[2] = 0.0;
  __return_storage_ptr__->m_data[3] = 0.0;
  switch(angset) {
  case EULERO:
    ChMatrix33<double>::Set_A_Eulero(&CStack_78,mangles);
    break;
  case CARDANO:
    ChMatrix33<double>::Set_A_Cardano(&CStack_78,mangles);
    break;
  case HPB:
    ChMatrix33<double>::Set_A_Hpb(&CStack_78,mangles);
    break;
  case RXYZ:
    ChMatrix33<double>::Set_A_Rxyz(&CStack_78,mangles);
    break;
  case RODRIGUEZ:
    ChMatrix33<double>::Set_A_Rodriguez(&CStack_78,mangles);
  }
  ChMatrix33<double>::Get_A_quaternion(&local_30,&CStack_78);
  ChQuaternion<double>::operator=(__return_storage_ptr__,&local_30);
  return __return_storage_ptr__;
}

Assistant:

ChQuaternion<double> Angle_to_Quat(AngleSet angset, const ChVector<double>& mangles) {
    ChQuaternion<double> res;
    ChMatrix33<> Acoord;

    switch (angset) {
        case AngleSet::EULERO:
            Acoord.Set_A_Eulero(mangles);
            break;
        case AngleSet::CARDANO:
            Acoord.Set_A_Cardano(mangles);
            break;
        case AngleSet::HPB:
            Acoord.Set_A_Hpb(mangles);
            break;
        case AngleSet::RXYZ:
            Acoord.Set_A_Rxyz(mangles);
            break;
        case AngleSet::RODRIGUEZ:
            Acoord.Set_A_Rodriguez(mangles);
            break;
        default:
            break;
    }
    res = Acoord.Get_A_quaternion();
    return res;
}